

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::parse_function_body(Parser *this,LexData *lex,FunctionNode *f)

{
  int iVar1;
  ulong uVar2;
  pointer pTVar3;
  CompoundStmt *pCVar4;
  ulong uVar5;
  
  std::__cxx11::string::_M_assign((string *)&(this->data).fn);
  this->lex_data = lex;
  iVar1 = f->body->beg_tok;
  uVar2 = (ulong)iVar1;
  this->tok_i = iVar1;
  if (((long)uVar2 < 0) ||
     (pTVar3 = (lex->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start,
     uVar5 = ((long)(lex->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pTVar3 >> 2) * -0x3333333333333333,
     uVar5 < uVar2 || uVar5 - uVar2 == 0)) {
    pTVar3 = &this->eof;
  }
  else {
    pTVar3 = pTVar3 + uVar2;
  }
  this->tok = pTVar3;
  pCVar4 = compound_statement(this);
  f->body->block = pCVar4;
  return;
}

Assistant:

void Parser::parse_function_body(const LexData& lex, FunctionNode* f)
{
  data.fn = lex.fn;
  lex_data = &lex;
  goto_token(f->body->beg_tok);
  f->body->block = compound_statement();
}